

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O2

GLFWcursor * glfwCreateCursor(GLFWimage *image,int xhot,int yhot)

{
  int iVar1;
  _GLFWcursor *cursor;
  
  if (_glfwInitialized == '\0') {
    cursor = (_GLFWcursor *)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    cursor = (_GLFWcursor *)calloc(1,0x10);
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;
    iVar1 = _glfwPlatformCreateCursor(cursor,image,xhot,yhot);
    if (iVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)cursor);
      cursor = (_GLFWcursor *)0x0;
    }
  }
  return (GLFWcursor *)cursor;
}

Assistant:

Cursor _glfwCreateCursor(const GLFWimage* image, int xhot, int yhot)
{
    int i;
    Cursor cursor;

    XcursorImage* native = XcursorImageCreate(image->width, image->height);
    if (native == NULL)
        return None;

    native->xhot = xhot;
    native->yhot = yhot;

    unsigned char* source = (unsigned char*) image->pixels;
    XcursorPixel* target = native->pixels;

    for (i = 0;  i < image->width * image->height;  i++, target++, source += 4)
    {
        *target = (source[3] << 24) |
                  (source[0] << 16) |
                  (source[1] <<  8) |
                   source[2];
    }

    cursor = XcursorImageLoadCursor(_glfw.x11.display, native);
    XcursorImageDestroy(native);

    return cursor;
}